

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,GBufferFilm *p,FilmBaseParameters *args,
          RGBColorSpace **args_1,float *args_2,bool *args_3,polymorphic_allocator<std::byte> *args_4
          )

{
  pointer pcVar1;
  undefined1 local_88 [48];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_88._16_8_ = (args->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  local_88._0_8_ = (args->fullResolution).super_Tuple2<pbrt::Point2,_int>;
  local_88._8_8_ = (args->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  local_88._24_8_ =
       (args->filter).
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       .bits;
  local_88._32_4_ = args->diagonal;
  local_88._36_4_ = *(undefined4 *)&args->field_0x24;
  local_88._40_8_ = args->sensor;
  pcVar1 = (args->filename)._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (args->filename)._M_string_length);
  pbrt::GBufferFilm::GBufferFilm
            (p,(FilmBaseParameters *)local_88,*args_1,*args_2,*args_3,args_4->memoryResource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }